

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall crnlib::crn_comp::optimize_alpha_selectors(crn_comp *this)

{
  uint16 i_1;
  ushort uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  vector<unsigned_short> *this_00;
  uint16 i_2;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint16 i;
  ulong uVar11;
  bool bVar12;
  vector<unsigned_short> indices;
  vector<unsigned_long_long> selectors;
  uint8 D6 [4096];
  ulong uVar5;
  
  this_00 = this->m_selector_remaping + 1;
  uVar7 = (this->m_alpha_selectors).m_size;
  uVar1 = (ushort)uVar7;
  vector<unsigned_short>::resize(this_00,uVar7 & 0xffff,false);
  for (uVar11 = 0; uVar11 != 0x1000; uVar11 = uVar11 + 1) {
    D6[uVar11] = (&DAT_0019522b)[(uint)(uVar11 >> 3) & 7 ^ (uint)(uVar11 >> 9) & 0x7fffff] +
                 (&DAT_0019522b)[((uint)(uVar11 >> 6) & 0x3ffffff ^ (uint)uVar11) & 7];
  }
  vector<unsigned_long_long>::vector(&selectors,uVar7 & 0xffff);
  vector<unsigned_short>::vector(&indices,uVar7 & 0xffff);
  for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
    selectors.m_p[uVar11] = (this->m_alpha_selectors).m_p[uVar11];
    indices.m_p[uVar11] = (unsigned_short)uVar11;
  }
  uVar11 = 0;
  uVar5 = (ulong)uVar1;
  while (uVar4 = uVar5 - 1, uVar5 != 0) {
    uVar8 = 0;
    uVar7 = 0xffffffff;
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      uVar10 = selectors.m_p[uVar6] << 6;
      uVar9 = 0;
      uVar2 = uVar11;
      lVar3 = 8;
      while (bVar12 = lVar3 != 0, lVar3 = lVar3 + -1, bVar12) {
        uVar9 = uVar9 + D6[(uint)uVar2 & 0x3f | (uint)uVar10 & 0xfc0];
        uVar10 = uVar10 >> 6;
        uVar2 = uVar2 >> 6;
      }
      if (uVar9 < uVar7) {
        uVar7 = uVar9;
        uVar8 = (uint)uVar6;
      }
    }
    uVar2 = (ulong)((uVar8 & 0xffff) * 8);
    uVar11 = *(ulong *)((long)selectors.m_p + uVar2);
    uVar6 = (ulong)((uVar8 & 0xffff) * 2);
    this_00->m_p[*(ushort *)((long)indices.m_p + uVar6)] = uVar1 - (short)uVar5;
    *(unsigned_long_long *)((long)selectors.m_p + uVar2) = selectors.m_p[uVar4];
    *(unsigned_short *)((long)indices.m_p + uVar6) = indices.m_p[uVar4];
    uVar5 = uVar4;
  }
  pack_alpha_selectors(this,&this->m_packed_alpha_selectors,this_00);
  vector<unsigned_short>::~vector(&indices);
  vector<unsigned_long_long>::~vector(&selectors);
  return;
}

Assistant:

void crn_comp::optimize_alpha_selectors() {
  crnlib::vector<uint16>& remapping = m_selector_remaping[cAlpha0];
  uint16 n = m_alpha_selectors.size();
  remapping.resize(n);

  uint8 d[] = {0, 2, 3, 3, 5, 5, 4, 4};

  uint8 D6[0x1000];
  for (uint16 i = 0; i < 0x1000; i++)
    D6[i] = d[(i ^ i >> 6) & 7] + d[(i >> 3 ^ i >> 9) & 7];

  crnlib::vector<uint64> selectors(n);
  crnlib::vector<uint16> indices(n);
  for (uint16 i = 0; i < n; i++) {
    selectors[i] = m_alpha_selectors[i];
    indices[i] = i;
  }
  uint64 selected_selector = 0;
  for (uint16 left = n; left;) {
    uint16 selected_index = 0;
    uint min_error = cUINT32_MAX;
    for (uint16 i = 0; i < left; i++) {
      uint error = 0;
      for (uint64 selector = selectors[i] << 6, delta_selector = selected_selector, j = 0; j < 8; j++, selector >>= 6, delta_selector >>= 6)
        error += D6[(selector & 0xFC0) | (delta_selector & 0x3F)];
      if (error < min_error) {
        min_error = error;
        selected_index = i;
      }
    }
    selected_selector = selectors[selected_index];
    remapping[indices[selected_index]] = n - left;
    left--;
    selectors[selected_index] = selectors[left];
    indices[selected_index] = indices[left];
  }

  pack_alpha_selectors(m_packed_alpha_selectors, remapping);
}